

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::expand
          (Stack<std::pair<unsigned_int,_unsigned_int>_> *this)

{
  pair<unsigned_int,_unsigned_int> *ppVar1;
  pair<unsigned_int,_unsigned_int> *ppVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  uVar3 = sVar5 * 8;
  if (uVar3 == 0) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar3 < 0x11) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar3 < 0x19) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar3 < 0x21) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar3 < 0x31) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar3 < 0x41) {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppVar2 = (pair<unsigned_int,_unsigned_int> *)::operator_new(uVar3,0x10);
  }
  if (this->_capacity == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    do {
      ppVar2[uVar4] = this->_stack[uVar4];
      uVar4 = uVar4 + 1;
      uVar3 = this->_capacity;
    } while (uVar4 < uVar3);
    ppVar1 = this->_stack;
    if (ppVar1 != (pair<unsigned_int,_unsigned_int> *)0x0) {
      uVar4 = uVar3 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar1;
      }
      else if (uVar4 < 0x11) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar1;
      }
      else if (uVar4 < 0x19) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar1;
      }
      else if (uVar4 < 0x21) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar1;
      }
      else if (uVar4 < 0x31) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar1;
      }
      else if (uVar4 < 0x41) {
        ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar1;
      }
      else {
        operator_delete(ppVar1,0x10);
        uVar3 = this->_capacity;
      }
    }
  }
  this->_stack = ppVar2;
  this->_cursor = ppVar2 + uVar3;
  this->_end = ppVar2 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }